

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t1(int pi)

{
  undefined4 uVar1;
  undefined4 in_EDI;
  int v;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  char *pcVar2;
  undefined4 uVar3;
  
  printf("Mode/PUD/read/write tests.\n");
  set_mode(in_EDI,0x19,0);
  uVar1 = get_mode(in_EDI,0x19);
  pcVar2 = (char *)CONCAT44(in_EDI,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar2);
  uVar3 = (undefined4)((ulong)pcVar2 >> 0x20);
  set_pull_up_down(uVar3,0x19,2);
  uVar1 = gpio_read(uVar3,0x19);
  pcVar2 = (char *)CONCAT44(uVar3,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar2);
  uVar3 = (undefined4)((ulong)pcVar2 >> 0x20);
  set_pull_up_down(uVar3,0x19,1);
  uVar1 = gpio_read(uVar3,0x19);
  pcVar2 = (char *)CONCAT44(uVar3,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar2);
  uVar3 = (undefined4)((ulong)pcVar2 >> 0x20);
  gpio_write(uVar3,0x19,0);
  uVar1 = get_mode(uVar3,0x19);
  pcVar2 = (char *)CONCAT44(uVar3,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar2);
  uVar3 = (undefined4)((ulong)pcVar2 >> 0x20);
  uVar1 = gpio_read(uVar3,0x19);
  pcVar2 = (char *)CONCAT44(uVar3,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar2);
  uVar3 = (undefined4)((ulong)pcVar2 >> 0x20);
  gpio_write(uVar3,0x19,1);
  uVar1 = gpio_read(uVar3,0x19);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,
        (char *)CONCAT44(uVar3,uVar1));
  return;
}

Assistant:

void t1(int pi)
{
   int v;

   printf("Mode/PUD/read/write tests.\n");

   set_mode(pi, GPIO, PI_INPUT);
   v = get_mode(pi, GPIO);
   CHECK(1, 1, v, 0, 0, "set mode, get mode");

   set_pull_up_down(pi, GPIO, PI_PUD_UP);
   v = gpio_read(pi, GPIO);
   CHECK(1, 2, v, 1, 0, "set pull up down, read");

   set_pull_up_down(pi, GPIO, PI_PUD_DOWN);
   v = gpio_read(pi, GPIO);
   CHECK(1, 3, v, 0, 0, "set pull up down, read");

   gpio_write(pi, GPIO, PI_LOW);
   v = get_mode(pi, GPIO);
   CHECK(1, 4, v, 1, 0, "write, get mode");

   v = gpio_read(pi, GPIO);
   CHECK(1, 5, v, 0, 0, "read");

   gpio_write(pi, GPIO, PI_HIGH);
   v = gpio_read(pi, GPIO);
   CHECK(1, 6, v, 1, 0, "write, read");
}